

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoAssembler.cpp
# Opt level: O2

AssemblerReturnValues __thiscall
NanoAssembler::assembleToMemory
          (NanoAssembler *this,string *inputFile,uchar **bytecodeBuffer,uint *size)

{
  pointer pAVar1;
  bool bVar2;
  uchar *puVar3;
  AssemblerReturnValues AVar4;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *__range2;
  uint uVar5;
  string *this_00;
  pointer pAVar6;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> lines;
  string local_c8;
  AssemberInstruction inst;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelMap;
  
  lines.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lines.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lines.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  labelMap._M_h._M_buckets = &labelMap._M_h._M_single_bucket;
  labelMap._M_h._M_bucket_count = 1;
  labelMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  labelMap._M_h._M_element_count = 0;
  labelMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  labelMap._M_h._M_rehash_policy._M_next_resize = 0;
  labelMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &local_c8;
  std::__cxx11::string::string((string *)this_00,inputFile);
  bVar2 = readLines((NanoAssembler *)this_00,&local_c8,&lines,&labelMap);
  std::__cxx11::string::~string((string *)&local_c8);
  if (bVar2) {
    bVar2 = assemble(this,&lines,&labelMap);
    pAVar1 = lines.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (bVar2) {
      *size = 0;
      for (pAVar6 = lines.
                    super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
                    _M_impl.super__Vector_impl_data._M_start; pAVar6 != pAVar1; pAVar6 = pAVar6 + 1)
      {
        AssemberInstruction::AssemberInstruction(&inst,pAVar6);
        *size = *size + inst.length;
        std::__cxx11::string::~string((string *)&inst);
      }
      puVar3 = (uchar *)operator_new__((ulong)*size);
      pAVar1 = lines.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      *bytecodeBuffer = puVar3;
      uVar5 = 0;
      for (pAVar6 = lines.
                    super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
                    _M_impl.super__Vector_impl_data._M_start; pAVar6 != pAVar1; pAVar6 = pAVar6 + 1)
      {
        AssemberInstruction::AssemberInstruction(&inst,pAVar6);
        memcpy(*bytecodeBuffer + uVar5,inst.bytecode,(ulong)inst.length);
        uVar5 = uVar5 + inst.length;
        std::__cxx11::string::~string((string *)&inst);
      }
      AVar4 = Success;
    }
    else {
      AVar4 = AssemblerError;
    }
  }
  else {
    AVar4 = IOError;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&labelMap._M_h);
  std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::~vector(&lines);
  return AVar4;
}

Assistant:

AssemblerReturnValues NanoAssembler::assembleToMemory(std::string inputFile, unsigned char*& bytecodeBuffer, unsigned int& size) {
	std::vector<AssemberInstruction> lines;
	std::unordered_map<std::string, size_t> labelMap;
	// Load assembler file from disk
	if (!readLines(inputFile, lines, labelMap)) {
		return AssemblerReturnValues::IOError;
	}
	// Compile to bytecode
	if (assemble(lines, labelMap)) {
		size = 0;
		// Calculate the resulting bytecode size
		for (AssemberInstruction inst : lines) {
			size += inst.length;
		}
		// Allocate buffer to store the bytecode
		bytecodeBuffer = new unsigned char[size];
		if (bytecodeBuffer) {
			unsigned int index = 0;
			// Copy the bytecode to output buffer
			for (AssemberInstruction inst : lines) {
				memcpy(bytecodeBuffer + index, inst.bytecode, inst.length);
				index += inst.length;
			}
			return AssemblerReturnValues::Success;
		}
		return AssemblerReturnValues::MemoryAllocationError;
	}
	return AssemblerReturnValues::AssemblerError;
}